

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O1

SchemaElementDecl * __thiscall
xercesc_4_0::TraverseSchema::createSchemaElementDecl
          (TraverseSchema *this,DOMElement *elem,XMLCh *name,bool *isDuplicate,XMLCh **valConstraint
          ,bool topLevel)

{
  short sVar1;
  short sVar2;
  int iVar3;
  undefined4 extraout_var;
  short *psVar5;
  undefined4 extraout_var_00;
  SchemaElementDecl *this_00;
  short *psVar6;
  uint enclosingScope;
  undefined7 in_register_00000089;
  uint uriId;
  long *plVar4;
  
  if ((int)CONCAT71(in_register_00000089,topLevel) != 0) {
    uriId = this->fTargetNSURI;
    enclosingScope = 0xfffffffe;
    goto LAB_003379d8;
  }
  uriId = this->fEmptyNamespaceURI;
  enclosingScope = this->fCurrentScope;
  iVar3 = (*(elem->super_DOMNode)._vptr_DOMNode[0x2a])(elem,SchemaSymbols::fgATT_FORM);
  plVar4 = (long *)CONCAT44(extraout_var,iVar3);
  if (plVar4 == (long *)0x0) {
    psVar5 = (short *)0x0;
  }
  else {
    psVar5 = (short *)(**(code **)(*plVar4 + 0x150))(plVar4);
  }
  if ((psVar5 == (short *)0x0) || (*psVar5 == 0)) {
    if ((psVar5 != &SchemaSymbols::fgATTVAL_QUALIFIED) &&
       ((this->fSchemaInfo->fElemAttrDefaultQualified & 1) == 0)) goto LAB_0033797e;
LAB_003379aa:
    uriId = this->fTargetNSURI;
  }
  else {
    if (psVar5 == &SchemaSymbols::fgATTVAL_QUALIFIED) goto LAB_003379aa;
LAB_0033797e:
    psVar6 = &SchemaSymbols::fgATTVAL_QUALIFIED;
    if (psVar5 == (short *)0x0) {
LAB_003379a4:
      if (*psVar6 == 0) goto LAB_003379aa;
    }
    else {
      do {
        sVar1 = *psVar5;
        if (sVar1 == 0) goto LAB_003379a4;
        psVar5 = psVar5 + 1;
        sVar2 = *psVar6;
        psVar6 = psVar6 + 1;
      } while (sVar1 == sVar2);
    }
  }
  iVar3 = (*(this->fSchemaGrammar->super_Grammar).super_XSerializable._vptr_XSerializable[0xb])
                    (this->fSchemaGrammar,(ulong)uriId,name,0,(ulong)enclosingScope);
  if ((SchemaElementDecl *)CONCAT44(extraout_var_00,iVar3) != (SchemaElementDecl *)0x0) {
    *isDuplicate = true;
    return (SchemaElementDecl *)CONCAT44(extraout_var_00,iVar3);
  }
LAB_003379d8:
  this_00 = (SchemaElementDecl *)XMemory::operator_new(0x80,this->fGrammarPoolMemoryManager);
  SchemaElementDecl::SchemaElementDecl
            (this_00,L"",name,uriId,Any,enclosingScope,this->fGrammarPoolMemoryManager);
  (this_00->super_XMLElementDecl).fCreateReason = Declared;
  if (topLevel) {
    this_00->fPSVIScope = SCP_GLOBAL;
  }
  processElemDeclAttrs(this,elem,this_00,valConstraint,topLevel);
  return this_00;
}

Assistant:

SchemaElementDecl*
TraverseSchema::createSchemaElementDecl(const DOMElement* const elem,
                                        const XMLCh* const name,
                                        bool& isDuplicate,
                                        const XMLCh*& valConstraint,
                                        const bool topLevel)
{
    unsigned int enclosingScope = fCurrentScope;
    int uriIndex = fEmptyNamespaceURI;

    if (topLevel) {

        uriIndex = fTargetNSURI;
        enclosingScope = Grammar::TOP_LEVEL_SCOPE;
    }
    else
    {
        const XMLCh* elemForm = getElementAttValue(elem, SchemaSymbols::fgATT_FORM);

        if (((!elemForm || !*elemForm) &&
            (fSchemaInfo->getElemAttrDefaultQualified() & Elem_Def_Qualified))
            || XMLString::equals(elemForm,SchemaSymbols::fgATTVAL_QUALIFIED))
            uriIndex = fTargetNSURI;

        // Check for duplicate elements
        SchemaElementDecl* other = (SchemaElementDecl*)
            fSchemaGrammar->getElemDecl(uriIndex, name, 0, enclosingScope);

        if (other != 0)
        {
            isDuplicate = true;
            return other;
        }
    }

    // create element decl and add it to the grammar
    Janitor<SchemaElementDecl>    elemDecl(new (fGrammarPoolMemoryManager) SchemaElementDecl(
        XMLUni::fgZeroLenString , name, uriIndex , SchemaElementDecl::Any
        , enclosingScope , fGrammarPoolMemoryManager
    ));

    elemDecl->setCreateReason(XMLElementDecl::Declared);

    if (topLevel)
        elemDecl->setPSVIScope(PSVIDefs::SCP_GLOBAL);

    // process attributes
    processElemDeclAttrs(elem, elemDecl.get(), valConstraint, topLevel);

    return elemDecl.release();
}